

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LinkedModelFile::MergeFrom(LinkedModelFile *this,LinkedModelFile *from)

{
  void *pvVar1;
  LogMessage *other;
  StringParameter *pSVar2;
  StringParameter *pSVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/LinkedModel.pb.cc"
               ,0x22c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pSVar3 = from->linkedmodelfilename_;
  if (pSVar3 != (StringParameter *)0x0 &&
      from != (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    pSVar2 = this->linkedmodelfilename_;
    if (pSVar2 == (StringParameter *)0x0) {
      pSVar2 = (StringParameter *)operator_new(0x20);
      StringParameter::StringParameter(pSVar2);
      this->linkedmodelfilename_ = pSVar2;
      pSVar3 = from->linkedmodelfilename_;
    }
    if (pSVar3 == (StringParameter *)0x0) {
      pSVar3 = (StringParameter *)&_StringParameter_default_instance_;
    }
    StringParameter::MergeFrom(pSVar2,pSVar3);
  }
  pSVar3 = from->linkedmodelsearchpath_;
  if (pSVar3 != (StringParameter *)0x0 &&
      from != (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    pSVar2 = this->linkedmodelsearchpath_;
    if (pSVar2 == (StringParameter *)0x0) {
      pSVar2 = (StringParameter *)operator_new(0x20);
      StringParameter::StringParameter(pSVar2);
      this->linkedmodelsearchpath_ = pSVar2;
      pSVar3 = from->linkedmodelsearchpath_;
    }
    if (pSVar3 == (StringParameter *)0x0) {
      pSVar3 = (StringParameter *)&_StringParameter_default_instance_;
    }
    StringParameter::MergeFrom(pSVar2,pSVar3);
  }
  return;
}

Assistant:

void LinkedModelFile::MergeFrom(const LinkedModelFile& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LinkedModelFile)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_linkedmodelfilename()) {
    mutable_linkedmodelfilename()->::CoreML::Specification::StringParameter::MergeFrom(from.linkedmodelfilename());
  }
  if (from.has_linkedmodelsearchpath()) {
    mutable_linkedmodelsearchpath()->::CoreML::Specification::StringParameter::MergeFrom(from.linkedmodelsearchpath());
  }
}